

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

void __thiscall
dg::llvmdg::LazyLLVMCallGraph::processBBlock
          (LazyLLVMCallGraph *this,Function *parent,BasicBlock *B,
          SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *queue)

{
  LLVMPointerAnalysis *pLVar1;
  LLVMPointsToSetImpl *pLVar2;
  char cVar3;
  bool bVar4;
  BasicBlock *pBVar5;
  undefined8 uVar6;
  BasicBlock *pBVar7;
  BasicBlock *pBVar8;
  BasicBlock *CI;
  undefined1 auVar9 [12];
  const_iterator __begin4;
  Function *F;
  const_iterator __end4;
  const_iterator local_78;
  LazyLLVMCallGraph *local_70;
  LLVMPointsToSetImpl *local_68;
  GenericCallGraph<const_llvm::Function_*> *local_60;
  BasicBlock *local_58;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *local_50;
  Function *local_48;
  const_iterator local_40;
  Function *local_38;
  
  pBVar8 = *(BasicBlock **)(B + 0x30);
  pBVar7 = B + 0x28;
  if (pBVar8 != pBVar7) {
    local_70 = this;
    local_60 = &this->_cg;
    local_58 = pBVar7;
    local_50 = queue;
    local_38 = parent;
    do {
      pBVar5 = pBVar8 + -0x18;
      if (pBVar8 == (BasicBlock *)0x0) {
        pBVar5 = (BasicBlock *)0x0;
      }
      CI = pBVar5;
      if (pBVar5[0x10] != (BasicBlock)0x53) {
        CI = (BasicBlock *)0x0;
      }
      if (pBVar5[0x10] == (BasicBlock)0x53 && pBVar8 != (BasicBlock *)0x0) {
        pLVar1 = local_70->_pta;
        uVar6 = llvm::Value::stripPointerCasts();
        (**(code **)(*(long *)pLVar1 + 8))(&local_68,pLVar1,uVar6);
        pLVar2 = local_68;
        if (local_68 == (LLVMPointsToSetImpl *)0x0) {
          local_78.impl = (LLVMPointsToSetImpl *)0x0;
        }
        else {
          cVar3 = (**(code **)(*(long *)local_68 + 0x38))(local_68);
          local_78.impl = (LLVMPointsToSetImpl *)0x0;
          if (cVar3 == '\0') {
            local_78.impl = pLVar2;
          }
        }
        local_40.impl = (LLVMPointsToSetImpl *)0x0;
        while (bVar4 = LLVMPointsToSet::const_iterator::operator==(&local_78,&local_40), !bVar4) {
          auVar9 = (**(code **)(*(long *)local_78.impl + 0x48))();
          local_48 = auVar9._0_8_;
          if (local_48[0x10] != (Function)0x0) {
            local_48 = (Function *)0x0;
          }
          if ((local_48 != (Function *)0x0) &&
             (bVar4 = anon_unknown_2::callIsCompatible(local_48,(CallInst *)CI,auVar9._8_4_), bVar4)
             ) {
            GenericCallGraph<const_llvm::Function_*>::addCall(&this->_cg,&local_38,&local_48);
            ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push(local_50,&local_48);
          }
          (**(code **)(*(long *)local_78.impl + 0x40))();
          cVar3 = (**(code **)(*(long *)local_78.impl + 0x38))();
          if (cVar3 != '\0') {
            local_78.impl = (LLVMPointsToSetImpl *)0x0;
          }
        }
        pBVar7 = local_58;
        if (local_68 != (LLVMPointsToSetImpl *)0x0) {
          (**(code **)(*(long *)local_68 + 0x58))();
          pBVar7 = local_58;
        }
      }
      pBVar8 = *(BasicBlock **)(pBVar8 + 8);
    } while (pBVar8 != pBVar7);
  }
  return;
}

Assistant:

void
    processBBlock(const llvm::Function *parent, const llvm::BasicBlock &B,
                  ADT::SetQueue<QueueFIFO<const llvm::Function *>> &queue) {
        assert(_pta && "This method can be used only with PTA");
        for (auto &I : B) {
            if (auto *C = llvm::dyn_cast<llvm::CallInst>(&I)) {
                auto pts = _pta->getLLVMPointsTo(_getCalledValue(C));
                for (const auto &ptr : pts) {
                    if (auto *F = llvm::dyn_cast<llvm::Function>(ptr.value)) {
                        if (callIsCompatible(F, C)) {
                            _cg.addCall(parent, F);
                            queue.push(F);
                        }
                    }
                }
            }
        }
    }